

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_container_iterator_t
container_init_iterator_last(container_t *c,uint8_t typecode,uint16_t *value)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  
  iVar3 = (int)CONCAT71(in_register_00000031,typecode);
  if (iVar3 == 3) {
    iVar3 = *c;
    uVar5 = iVar3 - 1;
    uVar4 = (uint)(ushort)(*(short *)(*(long *)((long)c + 8) + -2 + (long)iVar3 * 4) +
                          *(short *)(*(long *)((long)c + 8) + -4 + (long)iVar3 * 4));
  }
  else if (iVar3 == 2) {
    uVar4 = (uint)*(ushort *)(*(long *)((long)c + 8) + -2 + (long)*c * 2);
    uVar5 = *c - 1;
  }
  else {
    uVar5 = 0x3ff;
    iVar3 = 0x10000;
    do {
      uVar1 = *(ulong *)(*(long *)((long)c + 8) + (ulong)uVar5 * 8);
      uVar5 = uVar5 - 1;
      iVar3 = iVar3 + -0x40;
    } while (uVar1 == 0);
    lVar2 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar4 = ((uint)lVar2 ^ 0x3f) + iVar3 ^ 0x3f;
    uVar5 = uVar4;
  }
  *value = (uint16_t)uVar4;
  return (roaring_container_iterator_t)uVar5;
}

Assistant:

roaring_container_iterator_t container_init_iterator_last(const container_t *c,
                                                          uint8_t typecode,
                                                          uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            uint32_t wordindex = BITSET_CONTAINER_SIZE_IN_WORDS - 1;
            uint64_t word;
            while ((word = bc->words[wordindex]) == 0) {
                wordindex--;
            }
            // word is non-zero
            int32_t index =
                wordindex * 64 + (63 - roaring_leading_zeroes(word));
            *value = index;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = index,
            };
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            int32_t index = ac->cardinality - 1;
            *value = ac->array[index];
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = index,
            };
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            int32_t run_index = rc->n_runs - 1;
            const rle16_t *last_run = &rc->runs[run_index];
            *value = last_run->value + last_run->length;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = run_index,
            };
        }
        default:
            assert(false);
            roaring_unreachable;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{0};
    }
}